

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::optional_lite::optional<char>const&>::operator!=
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::optional_lite::optional<char>const&> *this,optional<long> *rhs)

{
  optional<char> *lhs;
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  lest local_90 [32];
  string local_70 [39];
  bool local_49;
  result local_48;
  optional<long> *local_20;
  optional<long> *rhs_local;
  expression_lhs<const_nonstd::optional_lite::optional<char>_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (optional<long> *)this;
  this_local = (expression_lhs<const_nonstd::optional_lite::optional<char>_&> *)
               __return_storage_ptr__;
  local_49 = nonstd::optional_lite::operator!=(*(optional<char> **)this,rhs);
  lhs = *(optional<char> **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"!=",&local_d1);
  std::__cxx11::string::string(local_b0,local_d0);
  to_string<nonstd::optional_lite::optional<char>,nonstd::optional_lite::optional<long>>
            (local_90,lhs,(string *)local_b0,local_20);
  std::__cxx11::string::string(local_70,(string *)local_90);
  result::result<bool>(&local_48,&local_49,(text *)local_70);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }